

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  long lVar48;
  long lVar49;
  undefined4 uVar50;
  long lVar51;
  ulong uVar52;
  size_t *psVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar75;
  undefined1 auVar73 [32];
  undefined1 auVar76 [16];
  float fVar80;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar81;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar87;
  undefined1 auVar86 [64];
  undefined1 auVar88 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar89;
  undefined1 auVar90 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  size_t local_2f0;
  size_t local_2d0;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 auVar74 [64];
  undefined1 auVar83 [64];
  
  aVar70.m128[2] = INFINITY;
  aVar70._0_8_ = 0x7f8000007f800000;
  aVar70.m128[3] = INFINITY;
  auVar74 = ZEXT1664((undefined1  [16])aVar70);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar70;
  aVar81.m128[2] = -INFINITY;
  aVar81._0_8_ = 0xff800000ff800000;
  aVar81.m128[3] = -INFINITY;
  auVar83 = ZEXT1664((undefined1  [16])aVar81);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar81;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar70;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar81;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar52 = r->_begin;
  local_2f0 = __return_storage_ptr__->end;
  aVar91 = aVar70;
  aVar89 = aVar81;
  if (uVar52 < r->_end) {
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    auVar68._8_4_ = 0x5dccb9a2;
    auVar68._0_8_ = 0x5dccb9a25dccb9a2;
    auVar68._12_4_ = 0x5dccb9a2;
    auVar69._8_4_ = 0xddccb9a2;
    auVar69._0_8_ = 0xddccb9a2ddccb9a2;
    auVar69._12_4_ = 0xddccb9a2;
    auVar94 = ZEXT1664((undefined1  [16])aVar70);
    auVar90 = ZEXT1664((undefined1  [16])aVar81);
    local_2d0 = k;
    do {
      uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar52);
      uVar54 = (ulong)(uVar5 + 3);
      pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar54 < (pBVar6->super_RawBufferView).num) {
        uVar56 = (ulong)((this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        psVar53 = &(pBVar6->super_RawBufferView).stride;
        bVar57 = false;
        uVar55 = 0;
        do {
          pcVar7 = ((RawBufferView *)(psVar53 + -2))->ptr_ofs;
          sVar8 = *psVar53;
          lVar51 = sVar8 * uVar5;
          lVar49 = sVar8 * (uVar5 + 1);
          lVar48 = sVar8 * (uVar5 + 2);
          auVar65 = vinsertps_avx(ZEXT416(*(uint *)(pcVar7 + lVar51 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar7 + lVar49 + 0xc)),0x10);
          auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(pcVar7 + lVar48 + 0xc)),0x20);
          auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(pcVar7 + sVar8 * uVar54 + 0xc)),0x30);
          auVar65 = vandps_avx(auVar65,auVar67);
          auVar65 = vcmpps_avx(auVar65,auVar68,5);
          if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar65[0xf] < '\0') {
LAB_012ed2aa:
            if (!bVar57) goto LAB_012ed5e0;
            break;
          }
          auVar65 = vcmpps_avx(*(undefined1 (*) [16])(pcVar7 + lVar51),auVar69,6);
          auVar59 = vcmpps_avx(*(undefined1 (*) [16])(pcVar7 + lVar51),auVar68,1);
          auVar65 = vandps_avx(auVar65,auVar59);
          uVar50 = vmovmskps_avx(auVar65);
          if ((~(byte)uVar50 & 7) != 0) goto LAB_012ed2aa;
          auVar65 = vcmpps_avx(*(undefined1 (*) [16])(pcVar7 + lVar49),auVar69,6);
          auVar59 = vcmpps_avx(*(undefined1 (*) [16])(pcVar7 + lVar49),auVar68,1);
          auVar65 = vandps_avx(auVar65,auVar59);
          uVar50 = vmovmskps_avx(auVar65);
          if ((~(byte)uVar50 & 7) != 0) goto LAB_012ed2aa;
          auVar65 = vcmpps_avx(*(undefined1 (*) [16])(pcVar7 + lVar48),auVar69,6);
          auVar59 = vcmpps_avx(*(undefined1 (*) [16])(pcVar7 + lVar48),auVar68,1);
          auVar65 = vandps_avx(auVar65,auVar59);
          uVar50 = vmovmskps_avx(auVar65);
          if ((~(byte)uVar50 & 7) != 0) goto LAB_012ed2aa;
          auVar65 = vcmpps_avx(*(undefined1 (*) [16])(pcVar7 + sVar8 * uVar54),auVar69,6);
          auVar59 = vcmpps_avx(*(undefined1 (*) [16])(pcVar7 + sVar8 * uVar54),auVar68,1);
          auVar65 = vandps_avx(auVar65,auVar59);
          uVar50 = vmovmskps_avx(auVar65);
          if ((~(byte)uVar50 & 7) != 0) goto LAB_012ed2aa;
          bVar57 = uVar56 <= uVar55;
          uVar55 = uVar55 + 1;
          psVar53 = psVar53 + 7;
        } while (uVar56 + 1 != uVar55);
        pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
        sVar8 = (pBVar6->super_RawBufferView).stride;
        lVar48 = uVar5 * sVar8;
        auVar65 = *(undefined1 (*) [16])(pcVar7 + lVar48);
        lVar51 = (uVar5 + 1) * sVar8;
        auVar59 = *(undefined1 (*) [16])(pcVar7 + lVar51);
        lVar49 = (uVar5 + 2) * sVar8;
        auVar60 = *(undefined1 (*) [16])(pcVar7 + lVar49);
        auVar76 = *(undefined1 (*) [16])(pcVar7 + uVar54 * sVar8);
        fVar4 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                maxRadiusScale;
        fVar12 = fVar4 * *(float *)(pcVar7 + lVar48 + 0xc);
        fVar13 = fVar4 * *(float *)(pcVar7 + lVar51 + 0xc);
        fVar14 = fVar4 * *(float *)(pcVar7 + lVar49 + 0xc);
        fVar4 = fVar4 * *(float *)(pcVar7 + uVar54 * sVar8 + 0xc);
        uVar5 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                tessellationRate;
        uVar54 = (ulong)uVar5;
        auVar71 = auVar74._0_16_;
        auVar82 = auVar83._0_16_;
        auVar64 = ZEXT416((uint)fVar4);
        auVar84 = ZEXT416((uint)fVar14);
        auVar96 = ZEXT416((uint)fVar13);
        if (uVar54 == 4) {
          auVar9 = vinsertps_avx(auVar76,ZEXT416((uint)fVar4),0x30);
          auVar15 = vshufps_avx(auVar76,auVar76,0);
          auVar72 = vshufps_avx(auVar76,auVar76,0x55);
          auVar16 = vshufps_avx(auVar76,auVar76,0xaa);
          auVar64 = vshufps_avx(ZEXT416((uint)fVar4),auVar64,0);
          auVar62 = vshufps_avx(auVar60,auVar60,0);
          auVar85 = vshufps_avx(auVar60,auVar60,0x55);
          auVar76 = vinsertps_avx(auVar60,ZEXT416((uint)fVar14),0x30);
          auVar17 = vshufps_avx(auVar60,auVar60,0xaa);
          auVar60 = vinsertps_avx(auVar59,ZEXT416((uint)fVar13),0x30);
          auVar84 = vshufps_avx(ZEXT416((uint)fVar14),auVar84,0);
          auVar18 = vshufps_avx(auVar59,auVar59,0);
          auVar19 = vshufps_avx(auVar59,auVar59,0x55);
          auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
          auVar20 = vshufps_avx(auVar65,auVar65,0);
          auVar96 = vshufps_avx(ZEXT416((uint)fVar13),auVar96,0);
          auVar21 = vshufps_avx(auVar65,auVar65,0x55);
          auVar65 = vshufps_avx(auVar65,auVar65,0xaa);
          auVar22 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
          auVar58._0_4_ =
               auVar20._0_4_ * (float)bspline_basis0._272_4_ +
               auVar18._0_4_ * (float)bspline_basis0._1428_4_ +
               auVar62._0_4_ * (float)bspline_basis0._2584_4_ +
               (float)bspline_basis0._3740_4_ * auVar15._0_4_;
          auVar58._4_4_ =
               auVar20._4_4_ * (float)bspline_basis0._276_4_ +
               auVar18._4_4_ * (float)bspline_basis0._1432_4_ +
               auVar62._4_4_ * (float)bspline_basis0._2588_4_ +
               (float)bspline_basis0._3744_4_ * auVar15._4_4_;
          auVar58._8_4_ =
               auVar20._8_4_ * (float)bspline_basis0._280_4_ +
               auVar18._8_4_ * (float)bspline_basis0._1436_4_ +
               auVar62._8_4_ * (float)bspline_basis0._2592_4_ +
               (float)bspline_basis0._3748_4_ * auVar15._8_4_;
          auVar58._12_4_ =
               auVar20._12_4_ * (float)bspline_basis0._284_4_ +
               auVar18._12_4_ * (float)bspline_basis0._1440_4_ +
               auVar62._12_4_ * (float)bspline_basis0._2596_4_ +
               (float)bspline_basis0._3752_4_ * auVar15._12_4_;
          auVar62._0_4_ =
               auVar21._0_4_ * (float)bspline_basis0._272_4_ +
               auVar19._0_4_ * (float)bspline_basis0._1428_4_ +
               auVar85._0_4_ * (float)bspline_basis0._2584_4_ +
               (float)bspline_basis0._3740_4_ * auVar72._0_4_;
          auVar62._4_4_ =
               auVar21._4_4_ * (float)bspline_basis0._276_4_ +
               auVar19._4_4_ * (float)bspline_basis0._1432_4_ +
               auVar85._4_4_ * (float)bspline_basis0._2588_4_ +
               (float)bspline_basis0._3744_4_ * auVar72._4_4_;
          auVar62._8_4_ =
               auVar21._8_4_ * (float)bspline_basis0._280_4_ +
               auVar19._8_4_ * (float)bspline_basis0._1436_4_ +
               auVar85._8_4_ * (float)bspline_basis0._2592_4_ +
               (float)bspline_basis0._3748_4_ * auVar72._8_4_;
          auVar62._12_4_ =
               auVar21._12_4_ * (float)bspline_basis0._284_4_ +
               auVar19._12_4_ * (float)bspline_basis0._1440_4_ +
               auVar85._12_4_ * (float)bspline_basis0._2596_4_ +
               (float)bspline_basis0._3752_4_ * auVar72._12_4_;
          auVar85._0_4_ =
               auVar65._0_4_ * (float)bspline_basis0._272_4_ +
               auVar59._0_4_ * (float)bspline_basis0._1428_4_ +
               auVar17._0_4_ * (float)bspline_basis0._2584_4_ +
               (float)bspline_basis0._3740_4_ * auVar16._0_4_;
          auVar85._4_4_ =
               auVar65._4_4_ * (float)bspline_basis0._276_4_ +
               auVar59._4_4_ * (float)bspline_basis0._1432_4_ +
               auVar17._4_4_ * (float)bspline_basis0._2588_4_ +
               (float)bspline_basis0._3744_4_ * auVar16._4_4_;
          auVar85._8_4_ =
               auVar65._8_4_ * (float)bspline_basis0._280_4_ +
               auVar59._8_4_ * (float)bspline_basis0._1436_4_ +
               auVar17._8_4_ * (float)bspline_basis0._2592_4_ +
               (float)bspline_basis0._3748_4_ * auVar16._8_4_;
          auVar85._12_4_ =
               auVar65._12_4_ * (float)bspline_basis0._284_4_ +
               auVar59._12_4_ * (float)bspline_basis0._1440_4_ +
               auVar17._12_4_ * (float)bspline_basis0._2596_4_ +
               (float)bspline_basis0._3752_4_ * auVar16._12_4_;
          auVar72._0_4_ =
               auVar22._0_4_ * (float)bspline_basis0._272_4_ +
               auVar96._0_4_ * (float)bspline_basis0._1428_4_ +
               (float)bspline_basis0._3740_4_ * auVar64._0_4_ +
               auVar84._0_4_ * (float)bspline_basis0._2584_4_;
          auVar72._4_4_ =
               auVar22._4_4_ * (float)bspline_basis0._276_4_ +
               auVar96._4_4_ * (float)bspline_basis0._1432_4_ +
               (float)bspline_basis0._3744_4_ * auVar64._4_4_ +
               auVar84._4_4_ * (float)bspline_basis0._2588_4_;
          auVar72._8_4_ =
               auVar22._8_4_ * (float)bspline_basis0._280_4_ +
               auVar96._8_4_ * (float)bspline_basis0._1436_4_ +
               (float)bspline_basis0._3748_4_ * auVar64._8_4_ +
               auVar84._8_4_ * (float)bspline_basis0._2592_4_;
          auVar72._12_4_ =
               auVar22._12_4_ * (float)bspline_basis0._284_4_ +
               auVar96._12_4_ * (float)bspline_basis0._1440_4_ +
               (float)bspline_basis0._3752_4_ * auVar64._12_4_ +
               auVar84._12_4_ * (float)bspline_basis0._2596_4_;
          auVar84 = vshufps_avx(auVar58,auVar58,0xb1);
          auVar65 = vminps_avx(auVar84,auVar58);
          auVar59 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vminps_avx(auVar59,auVar65);
          auVar96 = vshufps_avx(auVar62,auVar62,0xb1);
          auVar59 = vminps_avx(auVar96,auVar62);
          auVar64 = vshufpd_avx(auVar59,auVar59,1);
          auVar59 = vminps_avx(auVar64,auVar59);
          auVar65 = vinsertps_avx(auVar65,auVar59,0x1c);
          auVar15 = vshufps_avx(auVar85,auVar85,0xb1);
          auVar59 = vminps_avx(auVar15,auVar85);
          auVar64 = vshufpd_avx(auVar59,auVar59,1);
          auVar59 = vminps_avx(auVar64,auVar59);
          auVar59 = vinsertps_avx(auVar65,auVar59,0x20);
          auVar65 = vmaxps_avx(auVar84,auVar58);
          auVar64 = vshufpd_avx(auVar65,auVar65,1);
          auVar65 = vmaxps_avx(auVar64,auVar65);
          auVar64 = vmaxps_avx(auVar96,auVar62);
          auVar84 = vshufpd_avx(auVar64,auVar64,1);
          auVar64 = vmaxps_avx(auVar84,auVar64);
          auVar65 = vinsertps_avx(auVar65,auVar64,0x1c);
          auVar64 = vmaxps_avx(auVar15,auVar85);
          auVar84 = vshufpd_avx(auVar64,auVar64,1);
          auVar64 = vmaxps_avx(auVar84,auVar64);
          auVar64 = vinsertps_avx(auVar65,auVar64,0x20);
          auVar65 = vandps_avx(auVar72,auVar67);
          auVar84 = vshufps_avx(auVar65,auVar65,0xb1);
          auVar65 = vmaxps_avx(auVar84,auVar65);
          auVar84 = vshufps_avx(auVar65,auVar65,0);
          auVar65 = vshufps_avx(auVar65,auVar65,0xaa);
          auVar84 = vmaxps_avx(auVar65,auVar84);
          auVar65._0_4_ =
               auVar60._0_4_ * 0.16666667 + auVar76._0_4_ * 0.6666667 + auVar9._0_4_ * 0.16666667;
          auVar65._4_4_ =
               auVar60._4_4_ * 0.16666667 + auVar76._4_4_ * 0.6666667 + auVar9._4_4_ * 0.16666667;
          auVar65._8_4_ =
               auVar60._8_4_ * 0.16666667 + auVar76._8_4_ * 0.6666667 + auVar9._8_4_ * 0.16666667;
          auVar65._12_4_ =
               auVar60._12_4_ * 0.16666667 + auVar76._12_4_ * 0.6666667 + auVar9._12_4_ * 0.16666667
          ;
          auVar76 = vminps_avx(auVar59,auVar65);
          auVar59 = vmaxps_avx(auVar64,auVar65);
          auVar65 = vshufps_avx(auVar65,auVar65,0xff);
          auVar65 = vandps_avx(auVar65,auVar67);
          auVar60 = vmaxps_avx(auVar84,auVar65);
          auVar65 = vsubps_avx(auVar76,auVar60);
          auVar76._0_4_ = auVar59._0_4_ + auVar60._0_4_;
          auVar76._4_4_ = auVar59._4_4_ + auVar60._4_4_;
          auVar76._8_4_ = auVar59._8_4_ + auVar60._8_4_;
          auVar76._12_4_ = auVar59._12_4_ + auVar60._12_4_;
        }
        else {
          if ((int)uVar5 < 0) {
            auVar78 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar88._8_4_ = 0xff800000;
            auVar88._0_8_ = 0xff800000ff800000;
            auVar88._12_4_ = 0xff800000;
            auVar88._16_4_ = 0xff800000;
            auVar88._20_4_ = 0xff800000;
            auVar88._24_4_ = 0xff800000;
            auVar88._28_4_ = 0xff800000;
            auVar92._8_4_ = 0x7f800000;
            auVar92._0_8_ = 0x7f8000007f800000;
            auVar92._12_4_ = 0x7f800000;
            auVar92._16_4_ = 0x7f800000;
            auVar92._20_4_ = 0x7f800000;
            auVar92._24_4_ = 0x7f800000;
            auVar92._28_4_ = 0x7f800000;
            auVar97 = auVar88;
            auVar93 = auVar92;
            auVar95 = auVar92;
            auVar98 = auVar88;
          }
          else {
            auVar9 = vpshufd_avx(ZEXT416(uVar5),0);
            auVar15 = vshufps_avx(auVar65,auVar65,0);
            auVar72 = vshufps_avx(auVar65,auVar65,0x55);
            auVar65 = vshufps_avx(auVar65,auVar65,0xaa);
            auVar16 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
            auVar62 = vshufps_avx(auVar59,auVar59,0);
            auVar85 = vshufps_avx(auVar59,auVar59,0x55);
            auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
            auVar96 = vshufps_avx(auVar96,auVar96,0);
            auVar17 = vshufps_avx(auVar60,auVar60,0);
            auVar18 = vshufps_avx(auVar60,auVar60,0x55);
            auVar60 = vshufps_avx(auVar60,auVar60,0xaa);
            auVar84 = vshufps_avx(auVar84,auVar84,0);
            auVar19 = vshufps_avx(auVar76,auVar76,0);
            auVar20 = vshufps_avx(auVar76,auVar76,0x55);
            auVar86 = ZEXT1664(auVar20);
            auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
            auVar64 = vshufps_avx(auVar64,auVar64,0);
            lVar48 = uVar54 * 0x44;
            uVar55 = 0;
            auVar79 = ZEXT864(0) << 0x20;
            auVar92._8_4_ = 0x7f800000;
            auVar92._0_8_ = 0x7f8000007f800000;
            auVar92._12_4_ = 0x7f800000;
            auVar92._16_4_ = 0x7f800000;
            auVar92._20_4_ = 0x7f800000;
            auVar92._24_4_ = 0x7f800000;
            auVar92._28_4_ = 0x7f800000;
            auVar97._8_4_ = 0xff800000;
            auVar97._0_8_ = 0xff800000ff800000;
            auVar97._12_4_ = 0xff800000;
            auVar97._16_4_ = 0xff800000;
            auVar97._20_4_ = 0xff800000;
            auVar97._24_4_ = 0xff800000;
            auVar97._28_4_ = 0xff800000;
            auVar88 = auVar97;
            auVar93 = auVar92;
            auVar95 = auVar92;
            auVar98 = auVar97;
            do {
              auVar22 = vpshufd_avx(ZEXT416((uint)uVar55),0);
              auVar21 = vpor_avx(auVar22,_DAT_01ff0cf0);
              auVar22 = vpor_avx(auVar22,_DAT_02020ea0);
              auVar21 = vpcmpgtd_avx(auVar21,auVar9);
              auVar22 = vpcmpgtd_avx(auVar22,auVar9);
              auVar66._16_16_ = auVar22;
              auVar66._0_16_ = auVar21;
              pfVar1 = (float *)(lVar48 + 0x222c430 + uVar55 * 4);
              fVar4 = *pfVar1;
              fVar12 = pfVar1[1];
              fVar13 = pfVar1[2];
              fVar14 = pfVar1[3];
              fVar23 = pfVar1[4];
              fVar24 = pfVar1[5];
              fVar25 = pfVar1[6];
              pfVar2 = (float *)(lVar48 + 0x222c8b4 + uVar55 * 4);
              fVar26 = *pfVar2;
              fVar27 = pfVar2[1];
              fVar28 = pfVar2[2];
              fVar29 = pfVar2[3];
              fVar30 = pfVar2[4];
              fVar31 = pfVar2[5];
              fVar32 = pfVar2[6];
              local_1f8 = auVar19._0_4_;
              fStack_1f4 = auVar19._4_4_;
              fStack_1f0 = auVar19._8_4_;
              fStack_1ec = auVar19._12_4_;
              local_218 = auVar20._0_4_;
              fStack_214 = auVar20._4_4_;
              fStack_210 = auVar20._8_4_;
              fStack_20c = auVar20._12_4_;
              local_238 = auVar76._0_4_;
              fStack_234 = auVar76._4_4_;
              fStack_230 = auVar76._8_4_;
              fStack_22c = auVar76._12_4_;
              local_178 = auVar17._0_4_;
              fStack_174 = auVar17._4_4_;
              fStack_170 = auVar17._8_4_;
              fStack_16c = auVar17._12_4_;
              fVar87 = auVar86._28_4_;
              fVar75 = fVar87 + auVar74._28_4_;
              local_198 = auVar18._0_4_;
              fStack_194 = auVar18._4_4_;
              fStack_190 = auVar18._8_4_;
              fStack_18c = auVar18._12_4_;
              fVar80 = fVar87 + auVar79._28_4_;
              local_1b8 = auVar60._0_4_;
              fStack_1b4 = auVar60._4_4_;
              fStack_1b0 = auVar60._8_4_;
              fStack_1ac = auVar60._12_4_;
              pfVar3 = (float *)(lVar48 + 0x222bfac + uVar55 * 4);
              fVar33 = *pfVar3;
              fVar34 = pfVar3[1];
              fVar35 = pfVar3[2];
              fVar36 = pfVar3[3];
              fVar37 = pfVar3[4];
              fVar38 = pfVar3[5];
              fVar39 = pfVar3[6];
              fVar40 = pfVar3[7];
              local_258 = auVar64._0_4_;
              fStack_254 = auVar64._4_4_;
              fStack_250 = auVar64._8_4_;
              fStack_24c = auVar64._12_4_;
              local_1d8 = auVar84._0_4_;
              fStack_1d4 = auVar84._4_4_;
              fStack_1d0 = auVar84._8_4_;
              fStack_1cc = auVar84._12_4_;
              local_f8 = auVar62._0_4_;
              fStack_f4 = auVar62._4_4_;
              fStack_f0 = auVar62._8_4_;
              fStack_ec = auVar62._12_4_;
              local_118 = auVar85._0_4_;
              fStack_114 = auVar85._4_4_;
              fStack_110 = auVar85._8_4_;
              fStack_10c = auVar85._12_4_;
              local_138 = auVar59._0_4_;
              fStack_134 = auVar59._4_4_;
              fStack_130 = auVar59._8_4_;
              fStack_12c = auVar59._12_4_;
              pfVar3 = (float *)(bspline_basis0 + uVar55 * 4 + lVar48);
              fVar41 = *pfVar3;
              fVar42 = pfVar3[1];
              fVar43 = pfVar3[2];
              fVar44 = pfVar3[3];
              fVar45 = pfVar3[4];
              fVar46 = pfVar3[5];
              fVar47 = pfVar3[6];
              local_158 = auVar96._0_4_;
              fStack_154 = auVar96._4_4_;
              fStack_150 = auVar96._8_4_;
              fStack_14c = auVar96._12_4_;
              local_78 = auVar15._0_4_;
              fStack_74 = auVar15._4_4_;
              fStack_70 = auVar15._8_4_;
              fStack_6c = auVar15._12_4_;
              auVar63._0_4_ =
                   fVar41 * local_78 + fVar33 * local_f8 + fVar4 * local_178 + fVar26 * local_1f8;
              auVar63._4_4_ =
                   fVar42 * fStack_74 +
                   fVar34 * fStack_f4 + fVar12 * fStack_174 + fVar27 * fStack_1f4;
              auVar63._8_4_ =
                   fVar43 * fStack_70 +
                   fVar35 * fStack_f0 + fVar13 * fStack_170 + fVar28 * fStack_1f0;
              auVar63._12_4_ =
                   fVar44 * fStack_6c +
                   fVar36 * fStack_ec + fVar14 * fStack_16c + fVar29 * fStack_1ec;
              auVar63._16_4_ =
                   fVar45 * local_78 + fVar37 * local_f8 + fVar23 * local_178 + fVar30 * local_1f8;
              auVar63._20_4_ =
                   fVar46 * fStack_74 +
                   fVar38 * fStack_f4 + fVar24 * fStack_174 + fVar31 * fStack_1f4;
              auVar63._24_4_ =
                   fVar47 * fStack_70 +
                   fVar39 * fStack_f0 + fVar25 * fStack_170 + fVar32 * fStack_1f0;
              auVar63._28_4_ = fVar40 + pfVar2[7] + fVar75;
              local_98 = auVar72._0_4_;
              fStack_94 = auVar72._4_4_;
              fStack_90 = auVar72._8_4_;
              fStack_8c = auVar72._12_4_;
              auVar73._0_4_ =
                   fVar41 * local_98 + fVar33 * local_118 + fVar4 * local_198 + fVar26 * local_218;
              auVar73._4_4_ =
                   fVar42 * fStack_94 +
                   fVar34 * fStack_114 + fVar12 * fStack_194 + fVar27 * fStack_214;
              auVar73._8_4_ =
                   fVar43 * fStack_90 +
                   fVar35 * fStack_110 + fVar13 * fStack_190 + fVar28 * fStack_210;
              auVar73._12_4_ =
                   fVar44 * fStack_8c +
                   fVar36 * fStack_10c + fVar14 * fStack_18c + fVar29 * fStack_20c;
              auVar73._16_4_ =
                   fVar45 * local_98 + fVar37 * local_118 + fVar23 * local_198 + fVar30 * local_218;
              auVar73._20_4_ =
                   fVar46 * fStack_94 +
                   fVar38 * fStack_114 + fVar24 * fStack_194 + fVar31 * fStack_214;
              auVar73._24_4_ =
                   fVar47 * fStack_90 +
                   fVar39 * fStack_110 + fVar25 * fStack_190 + fVar32 * fStack_210;
              auVar73._28_4_ = fVar40 + fVar75 + fVar80;
              auVar74 = ZEXT3264(auVar73);
              auVar78 = vminps_avx(auVar95,auVar63);
              auVar95 = vblendvps_avx(auVar78,auVar95,auVar66);
              local_b8 = auVar65._0_4_;
              fStack_b4 = auVar65._4_4_;
              fStack_b0 = auVar65._8_4_;
              fStack_ac = auVar65._12_4_;
              auVar77._0_4_ =
                   fVar41 * local_b8 + fVar4 * local_1b8 + fVar26 * local_238 + fVar33 * local_138;
              auVar77._4_4_ =
                   fVar42 * fStack_b4 +
                   fVar12 * fStack_1b4 + fVar27 * fStack_234 + fVar34 * fStack_134;
              auVar77._8_4_ =
                   fVar43 * fStack_b0 +
                   fVar13 * fStack_1b0 + fVar28 * fStack_230 + fVar35 * fStack_130;
              auVar77._12_4_ =
                   fVar44 * fStack_ac +
                   fVar14 * fStack_1ac + fVar29 * fStack_22c + fVar36 * fStack_12c;
              auVar77._16_4_ =
                   fVar45 * local_b8 + fVar23 * local_1b8 + fVar30 * local_238 + fVar37 * local_138;
              auVar77._20_4_ =
                   fVar46 * fStack_b4 +
                   fVar24 * fStack_1b4 + fVar31 * fStack_234 + fVar38 * fStack_134;
              auVar77._24_4_ =
                   fVar47 * fStack_b0 +
                   fVar25 * fStack_1b0 + fVar32 * fStack_230 + fVar39 * fStack_130;
              auVar77._28_4_ = auVar78._28_4_ + fVar87 + auVar83._28_4_ + fVar80;
              auVar78 = vminps_avx(auVar92,auVar73);
              auVar92 = vblendvps_avx(auVar78,auVar92,auVar66);
              auVar78 = vminps_avx(auVar93,auVar77);
              auVar86 = ZEXT3264(auVar78);
              auVar93 = vblendvps_avx(auVar78,auVar93,auVar66);
              local_d8 = auVar16._0_4_;
              fStack_d4 = auVar16._4_4_;
              fStack_d0 = auVar16._8_4_;
              fStack_cc = auVar16._12_4_;
              auVar83 = ZEXT3264(CONCAT428(pfVar3[7],
                                           CONCAT424(fVar47 * fStack_d0,
                                                     CONCAT420(fVar46 * fStack_d4,
                                                               CONCAT416(fVar45 * local_d8,
                                                                         CONCAT412(fVar44 * 
                                                  fStack_cc,
                                                  CONCAT48(fVar43 * fStack_d0,
                                                           CONCAT44(fVar42 * fStack_d4,
                                                                    fVar41 * local_d8))))))));
              auVar61._0_4_ =
                   fVar41 * local_d8 + fVar33 * local_158 + fVar4 * local_1d8 + fVar26 * local_258;
              auVar61._4_4_ =
                   fVar42 * fStack_d4 +
                   fVar34 * fStack_154 + fVar12 * fStack_1d4 + fVar27 * fStack_254;
              auVar61._8_4_ =
                   fVar43 * fStack_d0 +
                   fVar35 * fStack_150 + fVar13 * fStack_1d0 + fVar28 * fStack_250;
              auVar61._12_4_ =
                   fVar44 * fStack_cc +
                   fVar36 * fStack_14c + fVar14 * fStack_1cc + fVar29 * fStack_24c;
              auVar61._16_4_ =
                   fVar45 * local_d8 + fVar37 * local_158 + fVar23 * local_1d8 + fVar30 * local_258;
              auVar61._20_4_ =
                   fVar46 * fStack_d4 +
                   fVar38 * fStack_154 + fVar24 * fStack_1d4 + fVar31 * fStack_254;
              auVar61._24_4_ =
                   fVar47 * fStack_d0 +
                   fVar39 * fStack_150 + fVar25 * fStack_1d0 + fVar32 * fStack_250;
              auVar61._28_4_ = pfVar3[7] + fVar40 + pfVar1[7] + pfVar2[7];
              auVar78 = vmaxps_avx(auVar98,auVar63);
              auVar98 = vblendvps_avx(auVar78,auVar98,auVar66);
              auVar78 = vmaxps_avx(auVar88,auVar73);
              auVar88 = vblendvps_avx(auVar78,auVar88,auVar66);
              auVar78 = vmaxps_avx(auVar97,auVar77);
              auVar97 = vblendvps_avx(auVar78,auVar97,auVar66);
              auVar78._8_4_ = 0x7fffffff;
              auVar78._0_8_ = 0x7fffffff7fffffff;
              auVar78._12_4_ = 0x7fffffff;
              auVar78._16_4_ = 0x7fffffff;
              auVar78._20_4_ = 0x7fffffff;
              auVar78._24_4_ = 0x7fffffff;
              auVar78._28_4_ = 0x7fffffff;
              auVar78 = vandps_avx(auVar61,auVar78);
              auVar78 = vmaxps_avx(auVar79._0_32_,auVar78);
              auVar78 = vblendvps_avx(auVar78,auVar79._0_32_,auVar66);
              auVar79 = ZEXT3264(auVar78);
              uVar55 = uVar55 + 8;
            } while (uVar55 <= uVar54);
          }
          auVar61 = vshufps_avx(auVar95,auVar95,0xb1);
          auVar95 = vminps_avx(auVar95,auVar61);
          auVar61 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vminps_avx(auVar95,auVar61);
          auVar65 = vminps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar95 = vshufps_avx(auVar92,auVar92,0xb1);
          auVar95 = vminps_avx(auVar92,auVar95);
          auVar92 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vminps_avx(auVar95,auVar92);
          auVar59 = vminps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar59 = vunpcklps_avx(auVar65,auVar59);
          auVar95 = vshufps_avx(auVar93,auVar93,0xb1);
          auVar95 = vminps_avx(auVar93,auVar95);
          auVar92 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vminps_avx(auVar95,auVar92);
          auVar65 = vminps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar65 = vinsertps_avx(auVar59,auVar65,0x28);
          auVar95 = vshufps_avx(auVar98,auVar98,0xb1);
          auVar95 = vmaxps_avx(auVar98,auVar95);
          auVar92 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vmaxps_avx(auVar95,auVar92);
          auVar59 = vmaxps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar95 = vshufps_avx(auVar88,auVar88,0xb1);
          auVar95 = vmaxps_avx(auVar88,auVar95);
          auVar92 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vmaxps_avx(auVar95,auVar92);
          auVar60 = vmaxps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar60 = vunpcklps_avx(auVar59,auVar60);
          auVar95 = vshufps_avx(auVar97,auVar97,0xb1);
          auVar95 = vmaxps_avx(auVar97,auVar95);
          auVar92 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vmaxps_avx(auVar95,auVar92);
          auVar59 = vmaxps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar59 = vinsertps_avx(auVar60,auVar59,0x28);
          auVar95 = vshufps_avx(auVar78,auVar78,0xb1);
          auVar95 = vmaxps_avx(auVar78,auVar95);
          auVar92 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vmaxps_avx(auVar95,auVar92);
          auVar60 = vmaxps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar60 = vshufps_avx(auVar60,auVar60,0);
          auVar65 = vsubps_avx(auVar65,auVar60);
          auVar76._0_4_ = auVar59._0_4_ + auVar60._0_4_;
          auVar76._4_4_ = auVar59._4_4_ + auVar60._4_4_;
          auVar76._8_4_ = auVar59._8_4_ + auVar60._8_4_;
          auVar76._12_4_ = auVar59._12_4_ + auVar60._12_4_;
        }
        auVar59 = vandps_avx(auVar65,auVar67);
        auVar60 = vandps_avx(auVar76,auVar67);
        auVar59 = vmaxps_avx(auVar59,auVar60);
        auVar60 = vmovshdup_avx(auVar59);
        auVar60 = vmaxss_avx(auVar60,auVar59);
        auVar59 = vshufpd_avx(auVar59,auVar59,1);
        auVar59 = vmaxss_avx(auVar59,auVar60);
        auVar59 = ZEXT416((uint)(auVar59._0_4_ * 4.7683716e-07));
        auVar59 = vshufps_avx(auVar59,auVar59,0);
        auVar65 = vsubps_avx(auVar65,auVar59);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar65,ZEXT416(geomID),0x30);
        auVar60._0_4_ = auVar76._0_4_ + auVar59._0_4_;
        auVar60._4_4_ = auVar76._4_4_ + auVar59._4_4_;
        auVar60._8_4_ = auVar76._8_4_ + auVar59._8_4_;
        auVar60._12_4_ = auVar76._12_4_ + auVar59._12_4_;
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar60,ZEXT416((uint)uVar52),0x30);
        auVar65 = vminps_avx(auVar71,(undefined1  [16])aVar10);
        auVar74 = ZEXT1664(auVar65);
        auVar65 = vmaxps_avx(auVar82,(undefined1  [16])aVar11);
        auVar83 = ZEXT1664(auVar65);
        auVar59._0_4_ = aVar10.x + aVar11.x;
        auVar59._4_4_ = aVar10.y + aVar11.y;
        auVar59._8_4_ = aVar10.z + aVar11.z;
        auVar59._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
        auVar65 = vminps_avx(auVar94._0_16_,auVar59);
        auVar94 = ZEXT1664(auVar65);
        auVar65 = vmaxps_avx(auVar90._0_16_,auVar59);
        auVar90 = ZEXT1664(auVar65);
        local_2f0 = local_2f0 + 1;
        prims[local_2d0].upper.field_0.field_1 = aVar11;
        prims[local_2d0].lower.field_0.field_1 = aVar10;
        local_2d0 = local_2d0 + 1;
      }
LAB_012ed5e0:
      aVar89 = auVar90._0_16_;
      aVar91 = auVar94._0_16_;
      aVar81 = auVar83._0_16_;
      aVar70 = auVar74._0_16_;
      uVar52 = uVar52 + 1;
    } while (uVar52 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar70;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar81;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar91;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar89;
  __return_storage_ptr__->end = local_2f0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }